

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcf_strfold(int n,mpc_val_t **xs)

{
  size_t sVar1;
  void *pvVar2;
  undefined8 *in_RSI;
  int in_EDI;
  size_t l;
  int i;
  long local_28;
  int local_1c;
  void *local_8;
  
  local_28 = 0;
  if (in_EDI == 0) {
    local_8 = calloc(1,1);
  }
  else {
    for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
      sVar1 = strlen((char *)in_RSI[local_1c]);
      local_28 = sVar1 + local_28;
    }
    pvVar2 = realloc((void *)*in_RSI,local_28 + 1);
    *in_RSI = pvVar2;
    for (local_1c = 1; local_1c < in_EDI; local_1c = local_1c + 1) {
      strcat((char *)*in_RSI,(char *)in_RSI[local_1c]);
      free((void *)in_RSI[local_1c]);
    }
    local_8 = (void *)*in_RSI;
  }
  return local_8;
}

Assistant:

mpc_val_t *mpcf_strfold(int n, mpc_val_t **xs) {
  int i;
  size_t l = 0;

  if (n == 0) { return calloc(1, 1); }

  for (i = 0; i < n; i++) { l += strlen(xs[i]); }

  xs[0] = realloc(xs[0], l + 1);

  for (i = 1; i < n; i++) {
    strcat(xs[0], xs[i]); free(xs[i]);
  }

  return xs[0];
}